

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

uchar * __thiscall CVmRun::compute_diff_dec(CVmRun *this,uchar *p)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  vm_val_t *pvVar2;
  int iVar3;
  vm_val_t val2;
  vm_val_t val;
  vm_val_t local_38;
  vm_val_t local_28;
  
  local_38.typ = VM_INT;
  local_38.val.obj = 1;
  iVar3 = compute_diff(this,sp_ + -1,&local_38);
  pvVar2 = sp_;
  if (iVar3 == 0) {
    local_28.typ = sp_[-1].typ;
    local_28._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    local_28.val = sp_[-1].val;
    aVar1._4_4_ = local_38.val._4_4_;
    aVar1.obj = local_38.val.obj;
    *(ulong *)(sp_ + -1) = CONCAT44(local_38._4_4_,local_38.typ);
    pvVar2[-1].val = aVar1;
    p = op_overload(this,(int)p - (int)entry_ptr_native_,-1,&local_28,G_predef_X.operator_sub,1,
                    0x7d7);
  }
  return p;
}

Assistant:

const uchar *CVmRun::compute_diff_dec(VMG_ const uchar *p)
{
    /* compute TOS - 1, leaving the result in TOS */
    vm_val_t val2;
    val2.set_int(1);
    if (compute_diff(vmg_ get(0), &val2))
    {
        return p;
    }
    else
    {
        /* no native implementation - check for an overload */
        vm_val_t val;
        pop(&val);
        push(&val2);
        return op_overload(vmg_ p - entry_ptr_native_, -1,
                           &val, G_predef->operator_sub, 1,
                           VMERR_BAD_TYPE_SUB);
    }
}